

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3SrcListDelete(sqlite3 *db,SrcList *pList)

{
  byte bVar1;
  int iVar2;
  anon_union_8_2_996c0f8d_for_u1 *paVar3;
  
  if (pList != (SrcList *)0x0) {
    paVar3 = &pList->a[0].u1;
    for (iVar2 = 0; iVar2 < pList->nSrc; iVar2 = iVar2 + 1) {
      sqlite3DbFree(db,paVar3[-0xb].zIndexedBy);
      sqlite3DbFree(db,paVar3[-10].zIndexedBy);
      sqlite3DbFree(db,paVar3[-9].zIndexedBy);
      bVar1 = *(byte *)((long)paVar3 + -0x23);
      if ((bVar1 & 2) != 0) {
        sqlite3DbFree(db,paVar3->zIndexedBy);
        bVar1 = *(byte *)((long)paVar3 + -0x23);
      }
      if ((bVar1 & 4) != 0) {
        sqlite3ExprListDelete(db,paVar3->pFuncArg);
      }
      sqlite3DeleteTable(db,(Table *)paVar3[-8].pFuncArg);
      sqlite3SelectDelete(db,(Select *)paVar3[-7].pFuncArg);
      sqlite3ExprDelete(db,(Expr *)paVar3[-3].pFuncArg);
      sqlite3IdListDelete(db,(IdList *)paVar3[-2].pFuncArg);
      paVar3 = paVar3 + 0xe;
    }
    sqlite3DbFreeNN(db,pList);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListDelete(sqlite3 *db, SrcList *pList){
  int i;
  struct SrcList_item *pItem;
  if( pList==0 ) return;
  for(pItem=pList->a, i=0; i<pList->nSrc; i++, pItem++){
    sqlite3DbFree(db, pItem->zDatabase);
    sqlite3DbFree(db, pItem->zName);
    sqlite3DbFree(db, pItem->zAlias);
    if( pItem->fg.isIndexedBy ) sqlite3DbFree(db, pItem->u1.zIndexedBy);
    if( pItem->fg.isTabFunc ) sqlite3ExprListDelete(db, pItem->u1.pFuncArg);
    sqlite3DeleteTable(db, pItem->pTab);
    sqlite3SelectDelete(db, pItem->pSelect);
    sqlite3ExprDelete(db, pItem->pOn);
    sqlite3IdListDelete(db, pItem->pUsing);
  }
  sqlite3DbFreeNN(db, pList);
}